

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O0

BigInteger * __thiscall Rational::operator_cast_to_BigInteger(Rational *this)

{
  bool bVar1;
  long in_RSI;
  BigInteger *in_RDI;
  BigInteger *a;
  BigInteger *in_stack_ffffffffffffffd0;
  BigInteger *in_stack_ffffffffffffffd8;
  
  a = in_RDI;
  BigInteger::BigInteger((BigInteger *)(in_RSI + 0x20),in_RSI);
  bVar1 = ::operator==(a,in_RDI);
  BigInteger::~BigInteger((BigInteger *)0x117909);
  if (bVar1) {
    BigInteger::BigInteger(a,in_RDI);
  }
  else {
    operator/(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  return a;
}

Assistant:

explicit operator const BigInteger() const
    {
        if(_denominator == 1)
            return _numerator;
        return _numerator / _denominator;
    }